

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseUrl(char *id,char *str)

{
  bool bVar1;
  int local_1c;
  char *pcStack_18;
  int i;
  char *str_local;
  char *id_local;
  
  local_1c = 0;
  pcStack_18 = str + 4;
  if (*pcStack_18 == '#') {
    pcStack_18 = str + 5;
  }
  while( true ) {
    bVar1 = false;
    if (local_1c < 0x3f) {
      bVar1 = *pcStack_18 != ')';
    }
    if (!bVar1) break;
    id[local_1c] = *pcStack_18;
    local_1c = local_1c + 1;
    pcStack_18 = pcStack_18 + 1;
  }
  id[local_1c] = '\0';
  return;
}

Assistant:

static void nsvg__parseUrl(char* id, const char* str)
{
	int i = 0;
	str += 4; // "url(";
	if (*str == '#')
		str++;
	while (i < 63 && *str != ')') {
		id[i] = *str++;
		i++;
	}
	id[i] = '\0';
}